

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-softmaxes.cc
# Opt level: O2

void __thiscall
dynet::LogSoftmax::backward_dev_impl<dynet::Device_CPU>
          (LogSoftmax *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  Tensor *pTVar1;
  float *pfVar2;
  uint uVar3;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> TVar4;
  initializer_list<unsigned_int> x;
  TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer> local_1a8;
  DefaultDevice *local_178;
  TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer> *local_170;
  TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer> local_168;
  TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer> local_148;
  Tensor local_128;
  TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer> local_e8;
  undefined1 local_c8 [40];
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_a0;
  int local_90;
  uint local_8c;
  uint local_88;
  uint local_80;
  int local_7c [7];
  DefaultDevice *local_60;
  TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer> *pTStack_58;
  long local_50;
  long lStack_48;
  
  pTVar1 = *(xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar3 = 1;
  if (1 < (pTVar1->d).nd) {
    uVar3 = (pTVar1->d).d[1];
  }
  local_c8._0_4_ = uVar3;
  x._M_len = 1;
  x._M_array = (iterator)local_c8;
  Dim::Dim(&local_128.d,x,(fx->d).bd);
  pfVar2 = (float *)(this->super_Node).aux_mem;
  local_128.device = fx->device;
  local_128.mem_pool = FXS;
  local_128.v = pfVar2;
  Tensor::tb<2>(&local_1a8,dEdf);
  local_c8._16_8_ = local_1a8.m_dimensions.super_array<long,_3>._M_elems[1];
  local_c8._24_8_ = local_1a8.m_dimensions.super_array<long,_3>._M_elems[2];
  local_c8._0_8_ = local_1a8.m_data;
  local_c8._8_8_ = local_1a8.m_dimensions.super_array<long,_3>._M_elems[0];
  local_c8._32_4_ = 0;
  local_8c = 1;
  if (local_128.d.nd != 0) {
    local_8c = local_128.d.d[0];
  }
  local_148.m_dimensions.super_array<long,_3>._M_elems[0] = (long)(int)local_8c;
  local_148.m_dimensions.super_array<long,_3>._M_elems[1] = (long)(int)local_128.d.bd;
  local_168.m_dimensions.super_array<long,_3>._M_elems[0] = (long)&local_148;
  local_168.m_data = (StoragePointerType)dev->edevice;
  local_148.m_data = pfVar2;
  Eigen::
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
  ::operator=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
               *)&local_168,
              (TensorReductionOp<Eigen::internal::SumReducer<float>,_const_std::array<int,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::MakePointer>
               *)local_c8);
  uVar3 = (fx->d).d[0];
  Tensor::tb<2>(&local_148,fx);
  local_1a8.m_dimensions.super_array<long,_3>._M_elems[1] =
       local_148.m_dimensions.super_array<long,_3>._M_elems[1];
  local_1a8.m_dimensions.super_array<long,_3>._M_elems[2] =
       local_148.m_dimensions.super_array<long,_3>._M_elems[2];
  local_1a8.m_data = local_148.m_data;
  local_1a8.m_dimensions.super_array<long,_3>._M_elems[0] =
       local_148.m_dimensions.super_array<long,_3>._M_elems[0];
  TVar4 = Tensor::tvec(&local_128);
  Tensor::tb<2>(&local_168,dEdf);
  local_c8._16_8_ = local_1a8.m_dimensions.super_array<long,_3>._M_elems[1];
  local_c8._24_8_ = local_1a8.m_dimensions.super_array<long,_3>._M_elems[2];
  local_c8._0_8_ = local_1a8.m_data;
  local_c8._8_8_ = local_1a8.m_dimensions.super_array<long,_3>._M_elems[0];
  local_90 = 1;
  local_88 = local_128.d.bd;
  local_7c[0] = 1;
  local_7c[1] = 1;
  local_60 = (DefaultDevice *)local_168.m_data;
  pTStack_58 = (TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer> *)
               local_168.m_dimensions.super_array<long,_3>._M_elems[0];
  local_50 = local_168.m_dimensions.super_array<long,_3>._M_elems[1];
  lStack_48 = local_168.m_dimensions.super_array<long,_3>._M_elems[2];
  local_a0 = TVar4;
  local_80 = uVar3;
  Tensor::tb<2>(&local_e8,dEdxi);
  local_178 = dev->edevice;
  local_170 = &local_e8;
  Eigen::
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,3,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
  ::operator+=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,3,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
                *)&local_178,
               (TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_3UL>,_const_Eigen::TensorReshapingOp<const_std::array<int,_3UL>,_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>
                *)local_c8);
  return;
}

Assistant:

void LogSoftmax::backward_dev_impl(const MyDevice & dev,
                             const vector<const Tensor*>& xs,
                             const Tensor& fx,
                             const Tensor& dEdf,
                             unsigned i,
                             Tensor& dEdxi) const {
  Tensor z(Dim({xs[0]->d.cols()},fx.d.bd), (float*)aux_mem, fx.device, DeviceMempool::FXS);
  // TODO? Is this broadcast efficient on CPU?
  Eigen::array<int, 1> red_axis; red_axis[0] = 0;
  z.tb<1>().device(*dev.edevice) = dEdf.tb<2>().sum(red_axis);
  Eigen::array<int, 3> bcast = {(int)fx.d.rows(), 1, 1};
  Eigen::array<int, 3> morph = {1, (int)z.d[0], (int)z.d.bd};
  dEdxi.tb<2>().device(*dev.edevice) += fx.tb<2>().exp() * -z.tvec().reshape(morph).broadcast(bcast) + dEdf.tb<2>();
}